

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermSubstitutionTree.hpp
# Opt level: O2

VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::Demodulation::Lhs>_>
 __thiscall
Indexing::TermSubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::getUwa
          (TermSubstitutionTree<Inferences::ALASCA::Demodulation::Lhs> *this,TypedTermList t,
          UnificationWithAbstraction uwa,bool fixedPointIteration)

{
  undefined7 in_register_00000081;
  undefined1 auStack_68 [56];
  
  Kernel::AbstractingUnifier::AbstractingUnifier
            ((AbstractingUnifier *)(auStack_68 + 8),
             (AbstractionOracle)
             (UnificationWithAbstraction)CONCAT71(in_register_00000081,fixedPointIteration));
  getResultIterator<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>,Kernel::AbstractingUnifier,Kernel::AbstractionOracle,bool>
            ((TermSubstitutionTree<Inferences::ALASCA::Demodulation::Lhs> *)auStack_68,t,
             SUB41(uwa,0),(AbstractingUnifier *)0x1,
             (AbstractionOracle)((int)auStack_68 + ALASCA_ONE_INTERP),fixedPointIteration);
  Lib::
  pvi<Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::Demodulation::Lhs>>>>
            ((Lib *)this,
             (IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::Demodulation::Lhs>_>_>
              *)auStack_68);
  Lib::
  VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::Demodulation::Lhs>_>
  ::~VirtualIterator((VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::Demodulation::Lhs>_>
                      *)auStack_68);
  Kernel::AbstractingUnifier::~AbstractingUnifier((AbstractingUnifier *)(auStack_68 + 8));
  return (VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::Demodulation::Lhs>_>
          )(IteratorCore<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::Demodulation::Lhs>_>
            *)this;
}

Assistant:

VirtualIterator<QueryRes<AbstractingUnifier*, LeafData>> getUwa(TypedTermList t, Options::UnificationWithAbstraction uwa, bool fixedPointIteration) final override
  { return pvi(getResultIterator<typename SubstitutionTree::template Iterator<RetrievalAlgorithms::UnificationWithAbstraction<AbstractingUnifier, RetrievalAlgorithms::DefaultVarBanks>>>(t, /* retrieveSubstitutions */ true, AbstractingUnifier::empty(AbstractionOracle(uwa)), AbstractionOracle(uwa), fixedPointIteration)); }